

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableStringFieldGenerator::GenerateMergingCode
          (ImmutableStringFieldGenerator *this,Printer *printer)

{
  bool bVar1;
  FileDescriptor *descriptor;
  Printer *printer_local;
  ImmutableStringFieldGenerator *this_local;
  
  descriptor = FieldDescriptor::file(this->descriptor_);
  bVar1 = SupportFieldPresence(descriptor);
  if (bVar1) {
    io::Printer::Print(printer,&this->variables_,
                       "if (other.has$capitalized_name$()) {\n  $set_has_field_bit_builder$\n  $name$_ = other.$name$_;\n  $on_changed$\n}\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,
                       "if (!other.get$capitalized_name$().isEmpty()) {\n  $name$_ = other.$name$_;\n  $on_changed$\n}\n"
                      );
  }
  return;
}

Assistant:

void ImmutableStringFieldGenerator::
GenerateMergingCode(io::Printer* printer) const {
  if (SupportFieldPresence(descriptor_->file())) {
    // Allow a slight breach of abstraction here in order to avoid forcing
    // all string fields to Strings when copying fields from a Message.
    printer->Print(variables_,
      "if (other.has$capitalized_name$()) {\n"
      "  $set_has_field_bit_builder$\n"
      "  $name$_ = other.$name$_;\n"
      "  $on_changed$\n"
      "}\n");
  } else {
    printer->Print(variables_,
      "if (!other.get$capitalized_name$().isEmpty()) {\n"
      "  $name$_ = other.$name$_;\n"
      "  $on_changed$\n"
      "}\n");
  }
}